

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareCompresedTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,formatDefinition *format
          ,resolutionDefinition *resolution,bool mutability)

{
  byte bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  InternalError *this_00;
  socklen_t __len;
  uint n_array_elements;
  sockaddr *__addr;
  undefined7 in_register_00000081;
  GLuint GVar5;
  uint uVar6;
  uint uVar7;
  GLuint image_size;
  GLubyte *image_data;
  undefined8 local_48;
  uint uStack_40;
  uint uStack_3c;
  textureDefinition *local_38;
  long lVar4;
  
  local_48 = CONCAT44(local_48._4_4_,(int)CONCAT71(in_register_00000081,mutability));
  GVar5 = 0;
  __len = 6;
  n_array_elements = resolution->m_depth / 6;
  local_38 = texture;
  bVar1 = getMipmapLevelCount(resolution->m_width,resolution->m_height);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  textureDefinition::bind(local_38,0x9009,__addr,__len);
  if ((int)local_48 == 0) {
    (**(code **)(lVar4 + 0x1398))
              (0x9009,bVar1,(format->m_source).m_internal_format,resolution->m_width,
               resolution->m_height,resolution->m_depth);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"texStorage3D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0xd38);
    local_48._0_4_ = resolution->m_width;
    local_48._4_4_ = resolution->m_height;
    uStack_40 = 0;
    uStack_3c = 0;
    for (; bVar1 != GVar5; GVar5 = GVar5 + 1) {
      image_data = (GLubyte *)0x0;
      image_size = 0;
      getCompressedTexture
                (resolution->m_width,resolution->m_height,n_array_elements,GVar5,&image_data,
                 &image_size);
      if (image_data == (GLubyte *)0x0) {
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_00,"Invalid compressed texture",fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                   ,0xd47);
        goto LAB_00d467f2;
      }
      (**(code **)(lVar4 + 0x2b0))
                (0x9009,GVar5,0,0,0,local_48 & 0xffffffff,local_48._4_4_,resolution->m_depth,
                 (format->m_source).m_internal_format,image_size,image_data);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"compressedTexSubImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                      ,0xd50);
      uVar6 = -(uint)(1 < (int)local_48 / 2);
      uVar7 = -(uint)(1 < local_48._4_4_ / 2);
      uStack_40 = (int)uStack_40 / 2 & -(uint)(0 < (int)uStack_40 / 2);
      uStack_3c = (int)uStack_3c / 2 & -(uint)(0 < (int)uStack_3c / 2);
      local_48 = CONCAT44(~uVar7 & 1 | local_48._4_4_ / 2 & uVar7,
                          ~uVar6 & 1 | (int)local_48 / 2 & uVar6);
    }
  }
  else {
    local_48._0_4_ = resolution->m_width;
    local_48._4_4_ = resolution->m_height;
    uStack_40 = 0;
    uStack_3c = 0;
    for (GVar5 = 0; bVar1 != GVar5; GVar5 = GVar5 + 1) {
      image_data = (GLubyte *)0x0;
      image_size = 0;
      getCompressedTexture
                (resolution->m_width,resolution->m_height,n_array_elements,GVar5,&image_data,
                 &image_size);
      if (image_data == (GLubyte *)0x0) {
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_00,"Invalid compressed texture",fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                   ,0xd65);
LAB_00d467f2:
        __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x290))
                (0x9009,GVar5,(format->m_source).m_internal_format,local_48 & 0xffffffff,
                 local_48._4_4_,resolution->m_depth,0,image_size,image_data);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"compressedTexImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                      ,0xd6c);
      uVar6 = -(uint)(1 < (int)local_48 / 2);
      uVar7 = -(uint)(1 < local_48._4_4_ / 2);
      uStack_40 = (int)uStack_40 / 2 & -(uint)(0 < (int)uStack_40 / 2);
      uStack_3c = (int)uStack_3c / 2 & -(uint)(0 < (int)uStack_3c / 2);
      local_48 = CONCAT44(~uVar7 & 1 | local_48._4_4_ / 2 & uVar7,
                          ~uVar6 & 1 | (int)local_48 / 2 & uVar6);
    }
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareCompresedTexture(const textureDefinition&	texture,
															  const formatDefinition&	 format,
															  const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint array_length	= resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);

		GLU_EXPECT_NO_ERROR(gl.getError(), "texStorage3D");

		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, 0, /* x_offset */
									   0,										   /* y offset */
									   0,										   /* z offset */
									   texture_width, texture_height, resolution.m_depth,
									   format.m_source.m_internal_format, image_size, image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexSubImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, format.m_source.m_internal_format,
									texture_width, texture_height, resolution.m_depth, 0 /* border */, image_size,
									image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
}